

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_growbuffer(upb_encstate *e,size_t bytes)

{
  char *__src;
  char *pcVar1;
  char *pcVar2;
  upb_Arena *a;
  char *pcVar3;
  char *size;
  char *pcVar4;
  char *__dest;
  ulong uVar5;
  char *pcVar6;
  
  __src = e->buf;
  pcVar1 = e->limit;
  pcVar2 = e->ptr;
  pcVar6 = (char *)0x80;
  do {
    size = pcVar6;
    pcVar6 = (char *)((long)size * 2);
  } while (size < pcVar1 + (bytes - (long)pcVar2));
  pcVar6 = pcVar1 + -(long)__src;
  a = e->arena;
  if (__src != (char *)0x0) {
    __dest = __src;
    if (size == pcVar6) goto LAB_0029526e;
    pcVar4 = (char *)((ulong)(pcVar6 + 7) & 0xfffffffffffffff8);
    if (size <= pcVar6) {
      if ((size != pcVar4) && (__src + (long)pcVar4 == a->ptr_dont_copy_me__upb_internal_use_only))
      {
        a->ptr_dont_copy_me__upb_internal_use_only = __src + (long)size;
      }
      goto LAB_0029526e;
    }
    uVar5 = (long)size - (long)pcVar4;
    if (uVar5 == 0) goto LAB_0029526e;
    pcVar3 = a->ptr_dont_copy_me__upb_internal_use_only;
    if ((__src + (long)pcVar4 == pcVar3) &&
       (uVar5 <= (ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar3))) {
      a->ptr_dont_copy_me__upb_internal_use_only = pcVar3 + uVar5;
      goto LAB_0029526e;
    }
  }
  __dest = a->ptr_dont_copy_me__upb_internal_use_only;
  if (a->end_dont_copy_me__upb_internal_use_only + -(long)__dest < size) {
    __dest = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,(size_t)size);
  }
  else {
    if ((char *)((ulong)(__dest + 7) & 0xfffffffffffffff8) != __dest) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = __dest + (long)size;
  }
  if ((pcVar1 != __src) && (__dest != (char *)0x0)) {
    pcVar4 = size;
    if (pcVar6 < size) {
      pcVar4 = pcVar6;
    }
    memcpy(__dest,__src,(size_t)pcVar4);
  }
LAB_0029526e:
  if (__dest == (char *)0x0) {
    encode_err(e,kUpb_EncodeStatus_OutOfMemory);
  }
  if (pcVar1 != __src) {
    memmove(__dest + ((long)size - (long)pcVar6),__dest,(size_t)pcVar6);
  }
  e->buf = __dest;
  e->limit = __dest + (long)size;
  e->ptr = __dest + (long)size + -(long)(pcVar1 + (bytes - (long)pcVar2));
  return;
}

Assistant:

UPB_NOINLINE
static void encode_growbuffer(upb_encstate* e, size_t bytes) {
  size_t old_size = e->limit - e->buf;
  size_t needed_size = bytes + (e->limit - e->ptr);
  size_t new_size = upb_roundup_pow2(needed_size);
  char* new_buf = upb_Arena_Realloc(e->arena, e->buf, old_size, new_size);

  if (!new_buf) encode_err(e, kUpb_EncodeStatus_OutOfMemory);

  // We want previous data at the end, realloc() put it at the beginning.
  // TODO: This is somewhat inefficient since we are copying twice.
  // Maybe create a realloc() that copies to the end of the new buffer?
  if (old_size > 0) {
    memmove(new_buf + new_size - old_size, new_buf, old_size);
  }

  e->buf = new_buf;
  e->limit = new_buf + new_size;
  e->ptr = new_buf + new_size - needed_size;
}